

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::DiffuseAreaLight::PDF_Le
          (DiffuseAreaLight *this,Interaction *intr,Vector3f *w,Float *pdfPos,Float *pdfDir)

{
  bool bVar1;
  char (*in_RCX) [18];
  char (*in_RDX) [7];
  char *unaff_RBX;
  char *in_RSI;
  long in_RDI;
  float *in_R8;
  Float FVar2;
  type cosTheta;
  type cosTheta_00;
  float fVar3;
  LogLevel unaff_retaddr;
  char (*in_stack_00000010) [7];
  Normal3<float> *in_stack_00000018;
  char (*in_stack_00000020) [18];
  Normal3<float> *in_stack_00000028;
  Normal3f vb;
  Normal3f va;
  Vector3<float> *in_stack_ffffffffffffff88;
  Normal3<float> *in_stack_ffffffffffffff90;
  Interaction *in_stack_ffffffffffffff98;
  ShapeHandle *in_stack_ffffffffffffffa0;
  Normal3<float> local_48;
  Tuple3<pbrt::Normal3,_float> local_3c;
  float *local_30;
  long lVar4;
  int line;
  
  local_3c._0_8_ = *(undefined8 *)(in_RSI + 0x28);
  local_3c.z = *(float *)(in_RSI + 0x30);
  local_30 = in_R8;
  lVar4 = in_RDI;
  Normal3<float>::Normal3
            (in_stack_ffffffffffffff90,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
             SUB84(in_stack_ffffffffffffff88,0),0.0);
  line = (int)((ulong)lVar4 >> 0x20);
  bVar1 = Tuple3<pbrt::Normal3,_float>::operator!=(&local_3c,&local_48);
  if (!bVar1) {
    LogFatal<char_const(&)[7],char_const(&)[18],char_const(&)[7],pbrt::Normal3<float>&,char_const(&)[18],pbrt::Normal3<float>&>
              (unaff_retaddr,unaff_RBX,line,in_RSI,in_RDX,in_RCX,in_stack_00000010,in_stack_00000018
               ,in_stack_00000020,in_stack_00000028);
  }
  FVar2 = ShapeHandle::PDF(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *(Float *)*in_RCX = FVar2;
  if ((*(byte *)(in_RDI + 0xd0) & 1) == 0) {
    cosTheta_00 = Dot<float>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    fVar3 = CosineHemispherePDF(cosTheta_00);
  }
  else {
    cosTheta = AbsDot<float>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    FVar2 = CosineHemispherePDF(cosTheta);
    fVar3 = FVar2 * 0.5;
  }
  *local_30 = fVar3;
  return;
}

Assistant:

void DiffuseAreaLight::PDF_Le(const Interaction &intr, Vector3f &w, Float *pdfPos,
                              Float *pdfDir) const {
    CHECK_NE(intr.n, Normal3f(0, 0, 0));
    *pdfPos = shape.PDF(intr);
    *pdfDir = twoSided ? (.5 * CosineHemispherePDF(AbsDot(intr.n, w)))
                       : CosineHemispherePDF(Dot(intr.n, w));
}